

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::NSSnapValues::AssertSnapEquiv
               (SlotArrayInfo *sai1,SlotArrayInfo *sai2,TTDCompareMap *compareMap)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool condition;
  
  TTDCompareMap::DiagnosticAssert(compareMap,sai1->ScriptContextLogId == sai2->ScriptContextLogId);
  TTDCompareMap::DiagnosticAssert
            (compareMap,sai1->isFunctionBodyMetaData == sai2->isFunctionBodyMetaData);
  if (sai1->isFunctionBodyMetaData == true) {
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_FunctionBody
              (compareMap,sai1->OptFunctionBodyId,sai2->OptFunctionBodyId);
  }
  TTDCompareMap::DiagnosticAssert(compareMap,sai1->SlotCount == sai2->SlotCount);
  uVar5 = 0;
  do {
    uVar3 = (ulong)sai1->SlotCount;
    if (uVar3 <= uVar5) {
      return;
    }
    uVar4 = 0xffffffffffffffff;
    do {
      if (uVar4 - uVar3 == -1) {
        condition = false;
        goto LAB_0085a219;
      }
      uVar1 = uVar4 + 1;
      lVar2 = uVar4 + 1;
      uVar4 = uVar1;
    } while (sai1->PIDArray[uVar5] != sai2->PIDArray[lVar2]);
    condition = uVar1 < uVar3;
    AssertSnapEquivTTDVar_SlotArray(sai1->Slots[uVar5],sai2->Slots[uVar1],compareMap,(uint32)uVar5);
LAB_0085a219:
    TTDCompareMap::DiagnosticAssert(compareMap,condition);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void AssertSnapEquiv(const SlotArrayInfo* sai1, const SlotArrayInfo* sai2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(sai1->ScriptContextLogId == sai2->ScriptContextLogId);

            compareMap.DiagnosticAssert(sai1->isFunctionBodyMetaData == sai2->isFunctionBodyMetaData);
            if(sai1->isFunctionBodyMetaData)
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_FunctionBody(sai1->OptFunctionBodyId, sai2->OptFunctionBodyId);
            }
            else
            {
                //TODO: emit debugger scope metadata
            }

            compareMap.DiagnosticAssert(sai1->SlotCount == sai2->SlotCount);
            for(uint32 i = 0; i < sai1->SlotCount; ++i)
            {
                Js::PropertyId id1 = sai1->PIDArray[i];
                bool found = false;
                for(uint32 j = 0; j < sai1->SlotCount; ++j)
                {
                    if(id1 == sai2->PIDArray[j])
                    {
                        AssertSnapEquivTTDVar_SlotArray(sai1->Slots[i], sai2->Slots[j], compareMap, i);
                        found = true;
                        break;
                    }
                }
                //TODO: We see this hit in a case where record has all values in a slot array when replaying --replay-debug (but not --replay).
                //      In the debug version the propertyId is in a Js::DebuggerScopeProperty instead. So this needs to be investigated in both extract and inflate.
                compareMap.DiagnosticAssert(found);
            }
        }